

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

int AF_A_WeaponOffset(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *self;
  int iVar3;
  int flags;
  char *__assertion;
  double wx;
  double wy;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004c764c;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_004c74dc:
        self = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004c764c;
        }
      }
      iVar3 = 0;
      wx = 0.0;
      wy = 32.0;
      flags = 0;
      if (numparam == 1) goto LAB_004c7622;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_004c763c;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_004c764c;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_004c763c;
      }
      wx = 0.0;
      wy = 32.0;
      flags = iVar3;
      if ((uint)numparam < 3) {
LAB_004c7622:
        A_OverlayOffset(self,1,wx,wy,flags);
        return 0;
      }
      VVar1 = param[2].field_0.field_3.Type;
      if ((VVar1 == 0xff) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
        if (numparam != 3) {
          VVar1 = param[3].field_0.field_3.Type;
          if (VVar1 == '\x01') {
            wx = param[3].field_0.f;
          }
          else if (VVar1 != 0xff) {
            __assert_fail("param[paramnum].Type == REGT_FLOAT",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                          ,0x3f6,
                          "int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
          }
          if (4 < (uint)numparam) {
            VVar1 = param[4].field_0.field_3.Type;
            if (VVar1 == '\x01') {
              wy = param[4].field_0.f;
            }
            else {
              if (VVar1 != 0xff) {
                __assert_fail("param[paramnum].Type == REGT_FLOAT",
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                              ,0x3f7,
                              "int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                             );
              }
              wy = 32.0;
            }
            if (numparam != 5) {
              VVar1 = param[5].field_0.field_3.Type;
              if (VVar1 == '\0') {
                flags = param[5].field_0.i;
              }
              else if (VVar1 != 0xff) {
                __assert_fail("param[paramnum].Type == REGT_INT",
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                              ,0x3f8,
                              "int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                             );
              }
            }
          }
        }
        goto LAB_004c7622;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_004c764c;
    }
    if (self == (AActor *)0x0) goto LAB_004c74dc;
  }
LAB_004c763c:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004c764c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x3f5,"int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WeaponOffset)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_FLOAT_OPT(wx) { wx = 0.; }
	PARAM_FLOAT_OPT(wy) { wy = 32.; }
	PARAM_INT_OPT(flags) { flags = 0; }
	A_OverlayOffset(self, PSP_WEAPON, wx, wy, flags);
	return 0;
}